

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O3

bool FIX::Session::sendToTarget(Message *message,SessionID *sessionID)

{
  Session *this;
  ssize_t sVar1;
  SessionNotFound *this_00;
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  string local_40;
  
  Message::setSessionID(message,sessionID);
  this = lookupSession(sessionID);
  if (this != (Session *)0x0) {
    sVar1 = send(this,(int)message,__buf,in_RCX,in_R8D);
    return SUB81(sVar1,0);
  }
  this_00 = (SessionNotFound *)__cxa_allocate_exception(0x50);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
  SessionNotFound::SessionNotFound(this_00,&local_40);
  __cxa_throw(this_00,&SessionNotFound::typeinfo,FIX::Exception::~Exception);
}

Assistant:

bool Session::sendToTarget( Message& message, const SessionID& sessionID )
EXCEPT ( SessionNotFound )
{
  message.setSessionID( sessionID );
  Session* pSession = lookupSession( sessionID );
  if ( !pSession ) throw SessionNotFound();
  return pSession->send( message );
}